

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection_handle.cpp
# Opt level: O0

bool __thiscall
libtorrent::peer_connection_handle::should_log(peer_connection_handle *this,direction_t direction)

{
  bool bVar1;
  element_type *this_00;
  undefined1 local_28 [8];
  shared_ptr<libtorrent::aux::peer_connection> pc;
  direction_t direction_local;
  peer_connection_handle *this_local;
  
  pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = direction;
  native_handle((peer_connection_handle *)local_28);
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_28);
  bVar1 = libtorrent::aux::peer_connection::should_log
                    (this_00,pc.
                             super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi._4_4_);
  ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
            ((shared_ptr<libtorrent::aux::peer_connection> *)local_28);
  return bVar1;
}

Assistant:

bool peer_connection_handle::should_log(peer_log_alert::direction_t direction) const
{
#ifndef TORRENT_DISABLE_LOGGING
	std::shared_ptr<aux::peer_connection> pc = native_handle();
	TORRENT_ASSERT(pc);
	return pc->should_log(direction);
#else
	TORRENT_UNUSED(direction);
	return false;
#endif
}